

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLXWindow glfwGetGLXWindow(GLFWwindow *handle)

{
  int error;
  
  if (_glfwInitialized == 0) {
    error = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x1f0) != 0) {
      return *(GLXWindow *)(handle + 0x270);
    }
    error = 0x1000a;
  }
  _glfwInputError(error,(char *)0x0);
  return 0;
}

Assistant:

GLFWAPI GLXWindow glfwGetGLXWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return None;
    }

    return window->context.glx.window;
}